

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_bspline(HairSetNode *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  size_t i_4;
  size_t i;
  size_t i_1;
  size_t i_3;
  size_t i_2;
  avector<Vec3ff> *in_stack_00000128;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_00000130;
  void *in_stack_fffffffffffffed8;
  ulong uVar4;
  value_type local_e8;
  ulong local_e0;
  undefined1 local_c8 [8];
  ulong local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  ulong local_a8;
  undefined1 *local_98;
  undefined1 *local_88;
  reference local_80;
  ulong local_78;
  reference local_70;
  ulong local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  size_t local_18;
  Vec3fx *local_10;
  reference local_8;
  
  if ((*(int *)(in_RDI + 0x70) == 0x18) || (*(int *)(in_RDI + 0x70) == 0x19)) {
    for (local_a8 = 0; uVar4 = local_a8,
        sVar1 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)(in_RDI + 0x78)), uVar4 < sVar1; local_a8 = local_a8 + 1) {
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    *)(in_RDI + 0x78),local_a8);
      bezier_to_bspline_helper(in_stack_00000130,in_stack_00000128);
      pvVar2 = std::
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)(in_RDI + 0x78),local_a8);
      local_88 = local_c8;
      for (local_78 = 0; local_78 < pvVar2->size_active; local_78 = local_78 + 1) {
      }
      local_18 = pvVar2->size_alloced;
      local_10 = pvVar2->items;
      local_80 = pvVar2;
      local_70 = pvVar2;
      local_8 = pvVar2;
      alignedFree(in_stack_fffffffffffffed8);
      pvVar2->items = (Vec3fx *)0x0;
      pvVar2->size_alloced = 0;
      pvVar2->size_active = 0;
      pvVar2->size_active = *(size_t *)(local_88 + 8);
      *(undefined8 *)(local_88 + 8) = 0;
      pvVar2->size_alloced = *(size_t *)(local_88 + 0x10);
      *(undefined8 *)(local_88 + 0x10) = 0;
      pvVar2->items = *(Vec3fx **)(local_88 + 0x18);
      *(undefined8 *)(local_88 + 0x18) = 0;
      local_98 = local_c8;
      for (local_58 = 0; local_58 < local_c0; local_58 = local_58 + 1) {
      }
      local_48 = local_b8;
      local_40 = local_b0;
      local_50 = local_98;
      local_38 = local_98;
      alignedFree(in_stack_fffffffffffffed8);
      local_b0 = 0;
      local_b8 = 0;
      local_c0 = 0;
    }
    local_e0 = 0;
    while (uVar4 = local_e0,
          sVar1 = std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                          *)(in_RDI + 0xd8)), uVar4 < sVar1) {
      Hair::Hair(&local_e8,(uint)(local_e0 << 2),0);
      pvVar3 = std::
               vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             *)(in_RDI + 0xd8),local_e0);
      *pvVar3 = local_e8;
      local_e0 = local_e0 + 1;
    }
    if (*(int *)(in_RDI + 0x70) == 0x18) {
      *(undefined4 *)(in_RDI + 0x70) = 0x20;
    }
    else {
      *(undefined4 *)(in_RDI + 0x70) = 0x21;
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_bspline()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    for (size_t i=0; i<positions.size(); i++) {
      positions[i] = bezier_to_bspline_helper(hairs,positions[i]);
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(4*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }